

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void * atomic_mmu_lookup(CPUArchState_conflict28 *env,target_ulong_conflict addr,TCGMemOpIdx oi,
                        uintptr_t retaddr)

{
  long lVar1;
  byte bVar2;
  _Bool _Var3;
  uint mmu_idx_00;
  MemOp memop;
  uint uVar4;
  target_ulong_conflict tVar5;
  ulong mmu_idx_01;
  uintptr_t retaddr_00;
  CPUState *pCVar6;
  CPUTLB_conflict5 *pCVar7;
  bool bVar8;
  void *hostaddr;
  int s_bits;
  int a_bits;
  MemOp mop;
  target_ulong_conflict tlb_addr;
  CPUTLBEntry *tlbe;
  uintptr_t index;
  size_t mmu_idx;
  uintptr_t retaddr_local;
  TCGMemOpIdx oi_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict28 *env_local;
  
  mmu_idx_00 = get_mmuidx(oi);
  mmu_idx_01 = (ulong)mmu_idx_00;
  tlbe = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
  _mop = tlb_entry(env,mmu_idx_01,addr);
  a_bits = tlb_addr_write(_mop);
  memop = get_memop(oi);
  uVar4 = get_alignment_bits(memop);
  bVar2 = (byte)memop;
  retaddr_00 = retaddr - 2;
  bVar8 = false;
  if (0 < (int)uVar4) {
    bVar8 = (addr & (1 << ((byte)uVar4 & 0x1f)) - 1U) != 0;
  }
  if (bVar8) {
    pCVar6 = env_cpu(env);
    cpu_unaligned_access(pCVar6,(ulong)addr,MMU_DATA_STORE,mmu_idx_00,retaddr_00);
  }
  if ((addr & (1 << (bVar2 & 3)) - 1U) == 0) {
    _Var3 = tlb_hit(env->uc,a_bits,addr);
    if (!_Var3) {
      _Var3 = victim_tlb_hit(env,mmu_idx_01,(size_t)tlbe,4,addr & 0xffffc000);
      if (!_Var3) {
        pCVar6 = env_cpu(env);
        tlb_fill(pCVar6,addr,1 << (bVar2 & 3),MMU_DATA_STORE,mmu_idx_00,retaddr_00);
        tlbe = (CPUTLBEntry *)tlb_index(env,mmu_idx_01,addr);
        _mop = tlb_entry(env,mmu_idx_01,addr);
      }
      tVar5 = tlb_addr_write(_mop);
      a_bits = tVar5 & 0xffffdfff;
    }
    if ((a_bits & 0x800U) == 0) {
      if ((_mop->field_0).field_0.addr_read == (a_bits & 0xffffefffU)) {
        lVar1 = *(long *)((long)&_mop->field_0 + 0x10);
        if ((a_bits & 0x1000U) != 0) {
          pCVar6 = env_cpu(env);
          pCVar7 = env_tlb(env);
          notdirty_write(pCVar6,(ulong)addr,1 << (bVar2 & 3),
                         pCVar7->d[mmu_idx_01].iotlb + (long)tlbe,retaddr_00);
        }
        return (void *)((ulong)addr + lVar1);
      }
      pCVar6 = env_cpu(env);
      tlb_fill(pCVar6,addr,1 << (bVar2 & 3),MMU_DATA_LOAD,mmu_idx_00,retaddr_00);
    }
  }
  pCVar6 = env_cpu(env);
  cpu_loop_exit_atomic_tricore(pCVar6,retaddr_00);
}

Assistant:

static void *atomic_mmu_lookup(CPUArchState *env, target_ulong addr,
                               TCGMemOpIdx oi, uintptr_t retaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = env->uc;
#endif
    size_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *tlbe = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = tlb_addr_write(tlbe);
    MemOp mop = get_memop(oi);
    int a_bits = get_alignment_bits(mop);
    int s_bits = mop & MO_SIZE;
    void *hostaddr;

    /* Adjust the given return address.  */
    retaddr -= GETPC_ADJ;

    /* Enforce guest required alignment.  */
    if (unlikely(a_bits > 0 && (addr & ((1 << a_bits) - 1)))) {
        /* ??? Maybe indicate atomic op to cpu_unaligned_access */
        cpu_unaligned_access(env_cpu(env), addr, MMU_DATA_STORE,
                             mmu_idx, retaddr);
    }

    /* Enforce qemu required alignment.  */
    if (unlikely(addr & ((1 << s_bits) - 1))) {
        /* We get here if guest alignment was not requested,
           or was not enforced by cpu_unaligned_access above.
           We might widen the access and emulate, but for now
           mark an exception and exit the cpu loop.  */
        goto stop_the_world;
    }

    /* Check TLB entry and enforce page permissions.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!VICTIM_TLB_HIT(addr_write, addr)) {
            tlb_fill(env_cpu(env), addr, 1 << s_bits, MMU_DATA_STORE,
                     mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            tlbe = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_addr_write(tlbe) & ~TLB_INVALID_MASK;
    }

    /* Notice an IO access or a needs-MMU-lookup access */
    if (unlikely(tlb_addr & TLB_MMIO)) {
        /* There's really nothing that can be done to
           support this apart from stop-the-world.  */
        goto stop_the_world;
    }

    /* Let the guest notice RMW on a write-only page.  */
    if (unlikely(tlbe->addr_read != (tlb_addr & ~TLB_NOTDIRTY))) {
        tlb_fill(env_cpu(env), addr, 1 << s_bits, MMU_DATA_LOAD,
                 mmu_idx, retaddr);
        /* Since we don't support reads and writes to different addresses,
           and we do have the proper page loaded for write, this shouldn't
           ever return.  But just in case, handle via stop-the-world.  */
        goto stop_the_world;
    }

    hostaddr = (void *)((uintptr_t)addr + tlbe->addend);

    if (unlikely(tlb_addr & TLB_NOTDIRTY)) {
        notdirty_write(env_cpu(env), addr, 1 << s_bits,
                       &env_tlb(env)->d[mmu_idx].iotlb[index], retaddr);
    }

    return hostaddr;

 stop_the_world:
    cpu_loop_exit_atomic(env_cpu(env), retaddr);
}